

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputNameComponent
          (VClient *this,string *i_rDeviceName,uint i_DeviceOutputIndex,string *o_rDeviceOutputName,
          string *o_rComponentName,Enum *o_rDeviceOutputUnit)

{
  bool bVar1;
  bool bVar2;
  reference rChannel_00;
  reference i_rDeviceOutputName;
  reference pVVar3;
  VChannelInfoExtra *rChannelInfoExtra;
  const_iterator ChannelUnitEnd;
  const_iterator ChannelUnitIt;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  const_iterator ComponentEnd;
  const_iterator ComponentIt;
  VChannelInfo *rChannel;
  const_iterator ChannelEnd;
  const_iterator ChannelIt;
  uint CurrentDeviceOutputIndex;
  UInt32 UStack_6c;
  bool bIsForcePlate;
  Enum _Result;
  uint DeviceID;
  Enum local_54;
  undefined1 local_50 [4];
  Enum GetResult;
  scoped_lock Lock;
  Enum *o_rDeviceOutputUnit_local;
  string *o_rComponentName_local;
  string *o_rDeviceOutputName_local;
  uint i_DeviceOutputIndex_local;
  string *i_rDeviceName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rDeviceOutputUnit;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_50,&this->m_FrameMutex);
  local_54 = Success;
  bVar1 = InitGet<std::__cxx11::string,std::__cxx11::string,ViconDataStreamSDK::Core::Unit::Enum>
                    (this,&local_54,o_rDeviceOutputName,o_rComponentName,(Enum *)Lock._8_8_);
  if (bVar1) {
    UStack_6c = 0;
    this_local._4_4_ = GetDeviceID(this,i_rDeviceName,&stack0xffffffffffffff94);
    if (this_local._4_4_ == Success) {
      bVar1 = IsForcePlateDevice(this,UStack_6c);
      ChannelIt._M_current._0_4_ = 0;
      ChannelEnd = std::
                   vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
                   ::begin(&(this->m_LatestFrame).m_Channels);
      rChannel = (VChannelInfo *)
                 std::
                 vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>::
                 end(&(this->m_LatestFrame).m_Channels);
      while (bVar2 = __gnu_cxx::operator!=
                               (&ChannelEnd,
                                (__normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
                                 *)&rChannel), bVar2) {
        rChannel_00 = __gnu_cxx::
                      __normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
                      ::operator*(&ChannelEnd);
        if (rChannel_00->m_DeviceID == UStack_6c) {
          ComponentEnd = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(&rChannel_00->m_ComponentNames);
          local_a0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&rChannel_00->m_ComponentNames);
          while (bVar2 = __gnu_cxx::operator!=(&ComponentEnd,&local_a0), bVar2) {
            if ((uint)ChannelIt._M_current == i_DeviceOutputIndex) {
              std::__cxx11::string::operator=
                        ((string *)o_rDeviceOutputName,(string *)&rChannel_00->m_Name);
              i_rDeviceOutputName =
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&ComponentEnd);
              ClientUtils::AdaptDeviceOutputName
                        ((string *)&ChannelUnitIt,i_rDeviceOutputName,(uint)ChannelIt._M_current);
              std::__cxx11::string::operator=((string *)o_rComponentName,(string *)&ChannelUnitIt);
              std::__cxx11::string::~string((string *)&ChannelUnitIt);
              if (bVar1) {
                bVar1 = IsForcePlateForceChannel(this,rChannel_00);
                if (bVar1) {
                  *(undefined4 *)Lock._8_8_ = 2;
                }
                else {
                  bVar1 = IsForcePlateMomentChannel(this,rChannel_00);
                  if (bVar1) {
                    *(undefined4 *)Lock._8_8_ = 3;
                  }
                  else {
                    bVar1 = IsForcePlateCoPChannel(this,rChannel_00);
                    if (bVar1) {
                      *(undefined4 *)Lock._8_8_ = 4;
                    }
                    else {
                      *(undefined4 *)Lock._8_8_ = 1;
                    }
                  }
                }
              }
              else {
                *(undefined4 *)Lock._8_8_ = 0;
                ChannelUnitEnd =
                     std::
                     vector<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                     ::begin(&(this->m_LatestFrame).m_ChannelUnits);
                rChannelInfoExtra =
                     (VChannelInfoExtra *)
                     std::
                     vector<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>
                     ::end(&(this->m_LatestFrame).m_ChannelUnits);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&ChannelUnitEnd,
                                          (__normal_iterator<const_ViconCGStream::VChannelInfoExtra_*,_std::vector<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>_>
                                           *)&rChannelInfoExtra), bVar1) {
                  pVVar3 = __gnu_cxx::
                           __normal_iterator<const_ViconCGStream::VChannelInfoExtra_*,_std::vector<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>_>
                           ::operator*(&ChannelUnitEnd);
                  if ((pVVar3->m_DeviceID == UStack_6c) &&
                     (pVVar3->m_ChannelID == rChannel_00->m_ChannelID)) {
                    bVar1 = std::operator==(&pVVar3->m_Unit,"meter");
                    if (bVar1) {
                      *(undefined4 *)Lock._8_8_ = 4;
                    }
                    else {
                      bVar1 = std::operator==(&pVVar3->m_Unit,"kilogram");
                      if (bVar1) {
                        *(undefined4 *)Lock._8_8_ = 5;
                      }
                      else {
                        bVar1 = std::operator==(&pVVar3->m_Unit,"second");
                        if (bVar1) {
                          *(undefined4 *)Lock._8_8_ = 6;
                        }
                        else {
                          bVar1 = std::operator==(&pVVar3->m_Unit,"ampere");
                          if (bVar1) {
                            *(undefined4 *)Lock._8_8_ = 7;
                          }
                          else {
                            bVar1 = std::operator==(&pVVar3->m_Unit,"kelvin");
                            if (bVar1) {
                              *(undefined4 *)Lock._8_8_ = 8;
                            }
                            else {
                              bVar1 = std::operator==(&pVVar3->m_Unit,"mole");
                              if (bVar1) {
                                *(undefined4 *)Lock._8_8_ = 9;
                              }
                              else {
                                bVar1 = std::operator==(&pVVar3->m_Unit,"candela");
                                if (bVar1) {
                                  *(undefined4 *)Lock._8_8_ = 10;
                                }
                                else {
                                  bVar1 = std::operator==(&pVVar3->m_Unit,"radian");
                                  if (bVar1) {
                                    *(undefined4 *)Lock._8_8_ = 0xb;
                                  }
                                  else {
                                    bVar1 = std::operator==(&pVVar3->m_Unit,"steradian");
                                    if (bVar1) {
                                      *(undefined4 *)Lock._8_8_ = 0xc;
                                    }
                                    else {
                                      bVar1 = std::operator==(&pVVar3->m_Unit,"meter squared");
                                      if (bVar1) {
                                        *(undefined4 *)Lock._8_8_ = 0xd;
                                      }
                                      else {
                                        bVar1 = std::operator==(&pVVar3->m_Unit,"meter cubed");
                                        if (bVar1) {
                                          *(undefined4 *)Lock._8_8_ = 0xe;
                                        }
                                        else {
                                          bVar1 = std::operator==(&pVVar3->m_Unit,"meter per second"
                                                                 );
                                          if (bVar1) {
                                            *(undefined4 *)Lock._8_8_ = 0xf;
                                          }
                                          else {
                                            bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                    "meter per second squared");
                                            if (bVar1) {
                                              *(undefined4 *)Lock._8_8_ = 0x10;
                                            }
                                            else {
                                              bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                      "radian per second");
                                              if (bVar1) {
                                                *(undefined4 *)Lock._8_8_ = 0x11;
                                              }
                                              else {
                                                bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                        "radian per second squared")
                                                ;
                                                if (bVar1) {
                                                  *(undefined4 *)Lock._8_8_ = 0x12;
                                                }
                                                else {
                                                  bVar1 = std::operator==(&pVVar3->m_Unit,"hertz");
                                                  if (bVar1) {
                                                    *(undefined4 *)Lock._8_8_ = 0x13;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(&pVVar3->m_Unit,"newton"
                                                                           );
                                                    if (bVar1) {
                                                      *(undefined4 *)Lock._8_8_ = 2;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                              "joule");
                                                      if (bVar1) {
                                                        *(undefined4 *)Lock._8_8_ = 0x14;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                "watt");
                                                        if (bVar1) {
                                                          *(undefined4 *)Lock._8_8_ = 0x15;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                  "pascal");
                                                          if (bVar1) {
                                                            *(undefined4 *)Lock._8_8_ = 0x16;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                    "lumen");
                                                            if (bVar1) {
                                                              *(undefined4 *)Lock._8_8_ = 0x17;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(&pVVar3->
                                                  m_Unit,"lux");
                                                  if (bVar1) {
                                                    *(undefined4 *)Lock._8_8_ = 0x18;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                            "coulomb");
                                                    if (bVar1) {
                                                      *(undefined4 *)Lock._8_8_ = 0x19;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(&pVVar3->m_Unit,"volt"
                                                                             );
                                                      if (bVar1) {
                                                        *(undefined4 *)Lock._8_8_ = 1;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                "ohm");
                                                        if (bVar1) {
                                                          *(undefined4 *)Lock._8_8_ = 0x1a;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                  "farad");
                                                          if (bVar1) {
                                                            *(undefined4 *)Lock._8_8_ = 0x1b;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                    "weber");
                                                            if (bVar1) {
                                                              *(undefined4 *)Lock._8_8_ = 0x1c;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(&pVVar3->
                                                  m_Unit,"tesla");
                                                  if (bVar1) {
                                                    *(undefined4 *)Lock._8_8_ = 0x1d;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(&pVVar3->m_Unit,"henry")
                                                    ;
                                                    if (bVar1) {
                                                      *(undefined4 *)Lock._8_8_ = 0x1e;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                              "siemens");
                                                      if (bVar1) {
                                                        *(undefined4 *)Lock._8_8_ = 0x1f;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                "becquerel");
                                                        if (bVar1) {
                                                          *(undefined4 *)Lock._8_8_ = 0x20;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                  "gray");
                                                          if (bVar1) {
                                                            *(undefined4 *)Lock._8_8_ = 0x21;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(&pVVar3->m_Unit,
                                                                                    "sievert");
                                                            if (bVar1) {
                                                              *(undefined4 *)Lock._8_8_ = 0x22;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(&pVVar3->
                                                  m_Unit,"katal");
                                                  if (bVar1) {
                                                    *(undefined4 *)Lock._8_8_ = 0x23;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  __gnu_cxx::
                  __normal_iterator<const_ViconCGStream::VChannelInfoExtra_*,_std::vector<ViconCGStream::VChannelInfoExtra,_std::allocator<ViconCGStream::VChannelInfoExtra>_>_>
                  ::operator++(&ChannelUnitEnd);
                }
              }
              this_local._4_4_ = Success;
              goto LAB_0013c29d;
            }
            ChannelIt._M_current._0_4_ = (uint)ChannelIt._M_current + 1;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&ComponentEnd);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_ViconCGStream::VChannelInfo_*,_std::vector<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>_>
        ::operator++(&ChannelEnd);
      }
      this_local._4_4_ = InvalidIndex;
    }
  }
  else {
    this_local._4_4_ = local_54;
  }
LAB_0013c29d:
  _Result = NotImplemented;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_50);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetDeviceOutputNameComponent( const std::string  & i_rDeviceName,
                                           const unsigned int   i_DeviceOutputIndex,
                                                 std::string  & o_rDeviceOutputName,
                                                 std::string  & o_rComponentName,
                                                 Unit::Enum   & o_rDeviceOutputUnit ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputName, o_rComponentName, o_rDeviceOutputUnit ) )
  {
    return GetResult; 
  }

  // Get the device id
  unsigned int DeviceID = 0;
  Result::Enum _Result = GetDeviceID( i_rDeviceName, DeviceID );
  if( Result::Success != _Result )
  {
    return _Result;
  }

  // Is this a forceplate?
  const bool bIsForcePlate( IsForcePlateDevice( DeviceID ) );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  const std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for( ; ChannelIt != ChannelEnd ; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( ; ComponentIt != ComponentEnd ; ++ComponentIt )
    {
      if( CurrentDeviceOutputIndex == i_DeviceOutputIndex )
      {
        o_rDeviceOutputName = rChannel.m_Name;
        o_rComponentName = AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex );

        if( bIsForcePlate )
        {
          // Determine where the data lives in this channel
          if( IsForcePlateForceChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Newton;
          }
          else if( IsForcePlateMomentChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::NewtonMeter;
          }
          else if( IsForcePlateCoPChannel( rChannel ) )
          {
            o_rDeviceOutputUnit = Unit::Meter;
          }
          else
          {
            o_rDeviceOutputUnit = Unit::Volt;
          }
        }
        else
        {
          // Not a forceplate.
          o_rDeviceOutputUnit = Unit::Unknown;

          // Look for information in the extra channel information.

          std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitIt  = m_LatestFrame.m_ChannelUnits.begin();
          const std::vector< ViconCGStream::VChannelInfoExtra >::const_iterator ChannelUnitEnd = m_LatestFrame.m_ChannelUnits.end();
          for( ; ChannelUnitIt != ChannelUnitEnd ; ++ChannelUnitIt )
          {
            const ViconCGStream::VChannelInfoExtra & rChannelInfoExtra( *ChannelUnitIt );

            // Wrong Device
            if( rChannelInfoExtra.m_DeviceID != DeviceID )
            {
              continue;
            }

            // Wrong Channel
            if( rChannelInfoExtra.m_ChannelID != rChannel.m_ChannelID )
            {
              continue;
            }

            if( rChannelInfoExtra.m_Unit == "meter" )
            {
              o_rDeviceOutputUnit = Unit::Meter;
            }
            else if( rChannelInfoExtra.m_Unit == "kilogram" )
            {
              o_rDeviceOutputUnit = Unit::Kilogram;
            }
            else if( rChannelInfoExtra.m_Unit == "second" )
            {
              o_rDeviceOutputUnit = Unit::Second;
            }
            else if( rChannelInfoExtra.m_Unit == "ampere" )
            {
              o_rDeviceOutputUnit = Unit::Ampere;
            }
            else if( rChannelInfoExtra.m_Unit == "kelvin" )
            {
              o_rDeviceOutputUnit = Unit::Kelvin;
            }
            else if( rChannelInfoExtra.m_Unit == "mole" )
            {
              o_rDeviceOutputUnit = Unit::Mole;
            }
            else if( rChannelInfoExtra.m_Unit == "candela" )
            {
              o_rDeviceOutputUnit = Unit::Candela;
            }
            else if( rChannelInfoExtra.m_Unit == "radian" )
            {
              o_rDeviceOutputUnit = Unit::Radian;
            }
            else if( rChannelInfoExtra.m_Unit == "steradian" )
            {
              o_rDeviceOutputUnit = Unit::Steradian;
            }
            else if( rChannelInfoExtra.m_Unit == "meter squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "meter cubed" )
            {
              o_rDeviceOutputUnit = Unit::MeterCubed;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "meter per second squared" )
            {
              o_rDeviceOutputUnit = Unit::MeterPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecond;
            }
            else if( rChannelInfoExtra.m_Unit == "radian per second squared" )
            {
              o_rDeviceOutputUnit = Unit::RadianPerSecondSquared;
            }
            else if( rChannelInfoExtra.m_Unit == "hertz" )
            {
              o_rDeviceOutputUnit = Unit::Hertz;
            }
            else if( rChannelInfoExtra.m_Unit == "newton" )
            {
              o_rDeviceOutputUnit = Unit::Newton;
            }
            else if( rChannelInfoExtra.m_Unit == "joule" )
            {
              o_rDeviceOutputUnit = Unit::Joule;
            }
            else if( rChannelInfoExtra.m_Unit == "watt" )
            {
              o_rDeviceOutputUnit = Unit::Watt;
            }
            else if( rChannelInfoExtra.m_Unit == "pascal" )
            {
              o_rDeviceOutputUnit = Unit::Pascal;
            }
            else if( rChannelInfoExtra.m_Unit == "lumen" )
            {
              o_rDeviceOutputUnit = Unit::Lumen;
            }
            else if( rChannelInfoExtra.m_Unit == "lux" )
            {
              o_rDeviceOutputUnit = Unit::Lux;
            }
            else if( rChannelInfoExtra.m_Unit == "coulomb" )
            {
              o_rDeviceOutputUnit = Unit::Coulomb;
            }
            else if( rChannelInfoExtra.m_Unit == "volt" )
            {
              o_rDeviceOutputUnit = Unit::Volt;
            }
            else if( rChannelInfoExtra.m_Unit == "ohm" )
            {
              o_rDeviceOutputUnit = Unit::Ohm;
            }
            else if( rChannelInfoExtra.m_Unit == "farad" )
            {
              o_rDeviceOutputUnit = Unit::Farad;
            }
            else if( rChannelInfoExtra.m_Unit == "weber" )
            {
              o_rDeviceOutputUnit = Unit::Weber;
            }
            else if( rChannelInfoExtra.m_Unit == "tesla" )
            {
              o_rDeviceOutputUnit = Unit::Tesla;
            }
            else if( rChannelInfoExtra.m_Unit == "henry" )
            {
              o_rDeviceOutputUnit = Unit::Henry;
            }
            else if( rChannelInfoExtra.m_Unit == "siemens" )
            {
              o_rDeviceOutputUnit = Unit::Siemens;
            }
            else if( rChannelInfoExtra.m_Unit == "becquerel" )
            {
              o_rDeviceOutputUnit = Unit::Becquerel;
            }
            else if( rChannelInfoExtra.m_Unit == "gray" )
            {
              o_rDeviceOutputUnit = Unit::Gray;
            }
            else if( rChannelInfoExtra.m_Unit == "sievert" )
            {
              o_rDeviceOutputUnit = Unit::Sievert;
            }
            else if( rChannelInfoExtra.m_Unit == "katal" )
            {
              o_rDeviceOutputUnit = Unit::Katal;
            }

          }
        }

        return Result::Success;
      }
      else
      {
        ++CurrentDeviceOutputIndex;
      }
    }
  }
  return Result::InvalidIndex;
}